

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O3

int __thiscall
CorUnix::CSynchCache<CorUnix::CSynchStateController>::Get
          (CSynchCache<CorUnix::CSynchStateController> *this,CPalThread *pthrCurrent,int n,
          CSynchStateController **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  CSynchStateController *__s;
  ulong uVar2;
  ulong uVar3;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var1 = (this->m_pHead).m_val;
  uVar3 = 0;
  if (0 < n && p_Var1 != (_USynchCacheStackNode *)0x0) {
    uVar3 = 0;
    do {
      ppObjs[uVar3] = (CSynchStateController *)p_Var1;
      p_Var1 = p_Var1->next;
      uVar3 = uVar3 + 1;
      if (p_Var1 == (_USynchCacheStackNode *)0x0) break;
    } while (uVar3 < (uint)n);
  }
  (this->m_pHead).m_val = p_Var1;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar3;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if ((int)uVar3 < n) {
    uVar3 = uVar3 & 0xffffffff;
    do {
      __s = (CSynchStateController *)InternalMalloc(0x30);
      if (__s == (CSynchStateController *)0x0) goto LAB_0013ca36;
      (__s->super_CSynchControllerBase).m_psdSynchData = (CSynchData *)0x0;
      *(undefined8 *)&(__s->super_CSynchControllerBase).m_wdWaitDomain = 0;
      (__s->super_CSynchControllerBase).m_ctCtrlrType = WaitController;
      (__s->super_CSynchControllerBase).m_odObjectDomain = ProcessLocalObject;
      (__s->super_CSynchControllerBase).m_potObjectType = (CObjectType *)0x0;
      (__s->super_ISynchStateController)._vptr_ISynchStateController = (_func_int **)0x0;
      (__s->super_CSynchControllerBase).m_pthrOwner = (CPalThread *)0x0;
      memset(__s,0,0x30);
      ppObjs[uVar3] = __s;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    uVar3 = (ulong)(uint)n;
  }
LAB_0013ca36:
  if ((int)uVar3 != 0) {
    uVar2 = 0;
    do {
      (ppObjs[uVar2]->super_ISynchStateController)._vptr_ISynchStateController =
           (_func_int **)&PTR_GetSignalCount_00187ca0;
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0xffffffff) != uVar2);
  }
  return (int)uVar3;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }